

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

menu_iter * menu_find_iter(menu_iter_id id)

{
  menu_iter *pmStack_10;
  menu_iter_id id_local;
  
  if (id == MN_ITER_ACTIONS) {
    pmStack_10 = &menu_iter_actions;
  }
  else if (id == MN_ITER_STRINGS) {
    pmStack_10 = &menu_iter_strings;
  }
  else {
    pmStack_10 = (menu_iter *)0x0;
  }
  return pmStack_10;
}

Assistant:

const menu_iter *menu_find_iter(menu_iter_id id)
{
	switch (id)
	{
		case MN_ITER_ACTIONS:
			return &menu_iter_actions;

		case MN_ITER_STRINGS:
			return &menu_iter_strings;
	}

	return NULL;
}